

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O3

void __thiscall
xatlas::internal::UniformGrid2::computePotentialEdges(UniformGrid2 *this,Vector2 p1,Vector2 p2)

{
  uint8_t *puVar1;
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  uint32_t edge2;
  undefined4 local_2c;
  
  (this->m_potentialEdges).m_base.size = 0;
  traverse(this,p1,p2);
  uVar3 = (this->m_traversedCellOffsets).m_base.size;
  if (uVar3 != 0) {
    uVar4 = 0;
    do {
      uVar5 = *(uint *)((this->m_traversedCellOffsets).m_base.buffer + uVar4 * 4);
      if ((this->m_cellDataOffsets).m_base.size <= uVar5) {
LAB_001b127f:
        __assert_fail("index < m_base.size",
                      "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                      ,0x4ae,
                      "T &xatlas::internal::Array<unsigned int>::operator[](uint32_t) [T = unsigned int]"
                     );
      }
      uVar5 = *(uint *)((this->m_cellDataOffsets).m_base.buffer + (ulong)uVar5 * 4);
      if (uVar5 != 0xffffffff) {
        uVar3 = (this->m_cellData).m_base.size;
        do {
          if (uVar3 <= uVar5) goto LAB_001b127f;
          local_2c = *(undefined4 *)((this->m_cellData).m_base.buffer + (ulong)uVar5 * 4);
          ArrayBase::push_back(&(this->m_potentialEdges).m_base,(uint8_t *)&local_2c);
          uVar3 = (this->m_cellData).m_base.size;
          if (uVar3 <= uVar5 + 1) goto LAB_001b127f;
          uVar5 = *(uint *)((this->m_cellData).m_base.buffer + (ulong)(uVar5 + 1) * 4);
        } while (uVar5 != 0xffffffff);
        uVar3 = (this->m_traversedCellOffsets).m_base.size;
      }
      uVar5 = (int)uVar4 + 1;
      uVar4 = (ulong)uVar5;
    } while (uVar5 < uVar3);
  }
  uVar3 = (this->m_potentialEdges).m_base.size;
  if (((ulong)uVar3 != 0) && (1 < (int)uVar3)) {
    puVar1 = (this->m_potentialEdges).m_base.buffer;
    uVar4 = 1;
    do {
      uVar5 = *(uint *)(puVar1 + uVar4 * 4);
      uVar6 = uVar4;
      do {
        if (*(uint *)(puVar1 + (uVar6 - 1 & 0xffffffff) * 4) <= uVar5) goto LAB_001b1264;
        *(uint *)(puVar1 + uVar6 * 4) = *(uint *)(puVar1 + (uVar6 - 1 & 0xffffffff) * 4);
        bVar2 = 1 < (long)uVar6;
        uVar6 = uVar6 - 1;
      } while (bVar2);
      uVar6 = 0;
LAB_001b1264:
      *(uint *)(puVar1 + (long)(int)uVar6 * 4) = uVar5;
      uVar4 = uVar4 + 1;
    } while (uVar4 != uVar3);
  }
  return;
}

Assistant:

void computePotentialEdges(Vector2 p1, Vector2 p2)
	{
		m_potentialEdges.clear();
		traverse(p1, p2);
		for (uint32_t j = 0; j < m_traversedCellOffsets.size(); j++) {
			const uint32_t cell = m_traversedCellOffsets[j];
			uint32_t offset = m_cellDataOffsets[cell];
			while (offset != UINT32_MAX) {
				const uint32_t edge2 = m_cellData[offset];
				m_potentialEdges.push_back(edge2);
				offset = m_cellData[offset + 1];
			}
		}
		if (m_potentialEdges.isEmpty())
			return;
		insertionSort(m_potentialEdges.data(), m_potentialEdges.size());
	}